

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_fma::forward_int8
          (Padding_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  void *pvVar3;
  int *piVar4;
  int iVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar26;
  ulong uVar27;
  undefined8 *puVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int x;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  undefined8 *puVar37;
  undefined8 *puVar38;
  int z;
  uint uVar39;
  ulong uVar40;
  undefined8 *puVar41;
  ulong uVar42;
  int iVar43;
  long lVar44;
  bool bVar45;
  Mat m;
  Mat m_1;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  undefined3 uVar16;
  undefined2 uVar18;
  ulong uVar25;
  
  uVar36 = bottom_blob->c;
  uVar22 = (ulong)uVar36;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar20 = bottom_blob->d;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      uVar24 = (this->super_Padding).left;
      if ((((uVar24 & 7) == 0) &&
          (uVar24 = uVar24 + m.w * 8 + (this->super_Padding).right, (uVar24 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,(int)uVar24 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator)
        ;
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar22 = (ulong)(this->super_Padding).value;
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,(this->super_Padding).left / 8,
                   (this->super_Padding).right / 8,
                   uVar22 << 0x38 | uVar22 << 0x30 | uVar22 << 0x28 |
                   uVar22 << 0x20 | uVar22 << 0x18 | uVar22 << 0x10 | uVar22 << 8 | uVar22);
        return 0;
      }
      break;
    case 2:
      uVar24 = (this->super_Padding).top;
      if ((((uVar24 & 7) == 0) &&
          (uVar24 = uVar24 + m.h * 8 + (this->super_Padding).bottom, (uVar24 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    (int)uVar24 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar22 = (ulong)(this->super_Padding).value;
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,(this->super_Padding).top / 8,
                   (this->super_Padding).bottom / 8,(this->super_Padding).left,
                   (this->super_Padding).right,
                   uVar22 << 0x38 | uVar22 << 0x30 | uVar22 << 0x28 |
                   uVar22 << 0x20 | uVar22 << 0x18 | uVar22 << 0x10 | uVar22 << 8 | uVar22);
        return 0;
      }
      break;
    case 3:
      uVar24 = (this->super_Padding).front;
      uVar39 = uVar24 + uVar36 * 8 + (this->super_Padding).behind;
      bVar45 = (uVar39 & 7) == 0;
      if (bVar45 && (uVar24 & 7) == 0) {
        if ((uVar39 == uVar36 * 8) || ((this->super_Padding).type == 0)) {
          uVar39 = (int)uVar39 >> 3;
          Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                      m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar39,
                      (m.elemsize >> 3) << bVar45 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          uVar22 = (long)(this->super_Padding).front / -8;
          uVar25 = uVar22 & 0xffffffff;
          if ((int)uVar39 < 1) {
            uVar39 = 0;
          }
          for (uVar42 = 0; uVar42 != uVar39; uVar42 = uVar42 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            sVar1 = top_blob->cstep;
            puVar28 = (undefined8 *)(sVar1 * uVar42 * m.elemsize + (long)pvVar3);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            uVar21 = (ulong)(this->super_Padding).value;
            uVar21 = uVar21 << 0x38 | uVar21 << 0x30 | uVar21 << 0x28 |
                     uVar21 << 0x20 | uVar21 << 0x18 | uVar21 << 0x10 | uVar21 << 8 | uVar21;
            uVar24 = (int)uVar22 + (int)uVar42;
            if ((int)uVar24 < 0 || (int)uVar36 <= (int)uVar24) {
              uVar24 = top_blob->d * (int)m.cstep;
              if ((int)uVar24 < 1) {
                uVar24 = 0;
              }
              for (uVar40 = 0; uVar24 != uVar40; uVar40 = uVar40 + 1) {
                *(ulong *)((long)pvVar3 + uVar40 * 8 + sVar1 * m.elemsize * uVar42) = uVar21;
              }
            }
            else {
              iVar20 = bottom_blob->w;
              lVar35 = (long)iVar20;
              iVar43 = bottom_blob->h;
              m_1.c = bottom_blob->d;
              pvVar3 = bottom_blob->data;
              uVar40 = bottom_blob->elemsize;
              sVar1 = bottom_blob->cstep;
              puVar41 = (undefined8 *)(uVar24 * sVar1 * uVar40 + (long)pvVar3);
              m_1.allocator = bottom_blob->allocator;
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.d = 1;
              m_1.dims = bottom_blob->dims + -1;
              m_1.cstep = (uVar40 * iVar43 * lVar35 + 0xf & 0xfffffffffffffff0) / uVar40;
              if (bottom_blob->dims == 4) {
                m_1.cstep = iVar43 * lVar35;
              }
              iVar32 = (this->super_Padding).type;
              m_1.w = iVar20;
              if (iVar32 == 0) {
                m.data = puVar28;
                m_1.data = puVar41;
                m_1.elemsize = uVar40;
                m_1.h = iVar43;
                padding_constant_pack8_int8_sse
                          (&m_1,&m,(this->super_Padding).top,(this->super_Padding).bottom,
                           (this->super_Padding).left,(this->super_Padding).right,uVar21);
                iVar32 = (this->super_Padding).type;
              }
              if (iVar32 == 2) {
                iVar32 = (this->super_Padding).top;
                uVar24 = (this->super_Padding).left;
                lVar33 = (long)(int)uVar24;
                uVar26 = 0;
                uVar21 = 0;
                if (0 < (int)uVar24) {
                  uVar21 = (ulong)uVar24;
                }
                iVar29 = 0;
                if (0 < iVar20) {
                  iVar29 = iVar20;
                }
                uVar24 = (this->super_Padding).right;
                uVar27 = (ulong)uVar24;
                if ((int)uVar24 < 1) {
                  uVar27 = uVar26;
                }
                iVar30 = iVar32;
                if (iVar32 < 1) {
                  iVar30 = 0;
                }
                puVar41 = puVar41 + iVar32 * iVar20;
                iVar23 = (this->super_Padding).bottom;
                lVar44 = (long)pvVar3 +
                         sVar1 * uVar40 * uVar25 + lVar33 * 8 + (long)(iVar32 * iVar20) * 8;
                for (; (int)uVar26 != iVar30; uVar26 = (ulong)((int)uVar26 + 1)) {
                  for (lVar34 = 0; -lVar34 != uVar21; lVar34 = lVar34 + -1) {
                    *puVar28 = *(undefined8 *)(lVar44 + lVar34 * 8);
                    puVar28 = puVar28 + 1;
                  }
                  puVar38 = puVar41;
                  for (iVar32 = 0; iVar32 != iVar29; iVar32 = iVar32 + 1) {
                    uVar2 = *puVar38;
                    puVar38 = puVar38 + 1;
                    *puVar28 = uVar2;
                    puVar28 = puVar28 + 1;
                  }
                  for (lVar34 = 0; -lVar34 != uVar27; lVar34 = lVar34 + -1) {
                    *puVar28 = puVar38[lVar34 + -2];
                    puVar28 = puVar28 + 1;
                  }
                  puVar41 = puVar41 + -lVar35;
                  lVar44 = lVar44 + lVar35 * -8;
                }
                iVar30 = 0;
                iVar32 = 0;
                if (0 < iVar43) {
                  iVar32 = iVar43;
                }
                for (; iVar30 != iVar32; iVar30 = iVar30 + 1) {
                  for (lVar44 = 0; -lVar44 != uVar21; lVar44 = lVar44 + -1) {
                    *puVar28 = puVar41[lVar33 + lVar44];
                    puVar28 = puVar28 + 1;
                  }
                  for (iVar43 = 0; iVar43 != iVar29; iVar43 = iVar43 + 1) {
                    uVar2 = *puVar41;
                    puVar41 = puVar41 + 1;
                    *puVar28 = uVar2;
                    puVar28 = puVar28 + 1;
                  }
                  for (lVar44 = 0; -lVar44 != uVar27; lVar44 = lVar44 + -1) {
                    *puVar28 = puVar41[lVar44 + -2];
                    puVar28 = puVar28 + 1;
                  }
                }
                puVar38 = puVar41 + -(long)(iVar20 * 2);
                iVar43 = 0;
                if (iVar23 < 1) {
                  iVar23 = 0;
                }
                puVar41 = puVar41 + (lVar33 - iVar20 * 2);
                for (; iVar43 != iVar23; iVar43 = iVar43 + 1) {
                  for (lVar33 = 0; -lVar33 != uVar21; lVar33 = lVar33 + -1) {
                    *puVar28 = puVar41[lVar33];
                    puVar28 = puVar28 + 1;
                  }
                  puVar37 = puVar38;
                  for (iVar20 = 0; iVar20 != iVar29; iVar20 = iVar20 + 1) {
                    uVar2 = *puVar37;
                    puVar37 = puVar37 + 1;
                    *puVar28 = uVar2;
                    puVar28 = puVar28 + 1;
                  }
                  for (lVar33 = 0; -lVar33 != uVar27; lVar33 = lVar33 + -1) {
                    *puVar28 = puVar37[lVar33 + -2];
                    puVar28 = puVar28 + 1;
                  }
                  puVar38 = puVar38 + -lVar35;
                  puVar41 = puVar41 + -lVar35;
                }
              }
              else if (iVar32 == 1) {
                iVar32 = (this->super_Padding).left;
                iVar30 = 0;
                iVar29 = 0;
                if (iVar32 < 1) {
                  iVar32 = iVar29;
                }
                if (iVar20 < 1) {
                  iVar20 = iVar29;
                }
                iVar23 = (this->super_Padding).right;
                if (iVar23 < 1) {
                  iVar23 = iVar29;
                }
                iVar31 = (this->super_Padding).top;
                if (iVar31 < 1) {
                  iVar31 = iVar29;
                }
                iVar29 = (this->super_Padding).bottom;
                lVar35 = sVar1 * uVar40 * uVar25;
                for (; iVar5 = iVar32, iVar30 != iVar31; iVar30 = iVar30 + 1) {
                  while (iVar5 != 0) {
                    *puVar28 = *puVar41;
                    puVar28 = puVar28 + 1;
                    iVar5 = iVar5 + -1;
                  }
                  for (lVar33 = 0; iVar5 = iVar23, iVar20 != (int)lVar33; lVar33 = lVar33 + 1) {
                    *puVar28 = *(undefined8 *)((long)pvVar3 + lVar33 * 8 + lVar35);
                    puVar28 = puVar28 + 1;
                  }
                  while (iVar5 != 0) {
                    *puVar28 = *(undefined8 *)((long)pvVar3 + lVar33 * 8 + lVar35 + -8);
                    puVar28 = puVar28 + 1;
                    iVar5 = iVar5 + -1;
                  }
                }
                iVar20 = 0;
                if (0 < m_1.w) {
                  iVar20 = m_1.w;
                }
                iVar30 = 0;
                iVar31 = 0;
                if (0 < iVar43) {
                  iVar30 = 0;
                  iVar31 = iVar43;
                }
                for (; iVar43 = iVar32, iVar30 != iVar31; iVar30 = iVar30 + 1) {
                  while (iVar43 != 0) {
                    *puVar28 = *puVar41;
                    puVar28 = puVar28 + 1;
                    iVar43 = iVar43 + -1;
                  }
                  lVar33 = 0;
                  for (lVar35 = 0; iVar20 != (int)lVar35; lVar35 = lVar35 + 1) {
                    puVar28[lVar35] = puVar41[lVar35];
                    lVar33 = lVar33 + -8;
                  }
                  puVar28 = (undefined8 *)((long)puVar28 - lVar33);
                  iVar43 = iVar23;
                  while (bVar45 = iVar43 != 0, iVar43 = iVar43 + -1, bVar45) {
                    *puVar28 = puVar41[lVar35 + -1];
                    puVar28 = puVar28 + 1;
                  }
                  puVar41 = (undefined8 *)((long)puVar41 - lVar33);
                }
                puVar41 = puVar41 + -(long)m_1.w;
                iVar43 = 0;
                if (iVar29 < 1) {
                  iVar29 = iVar43;
                }
                for (; iVar30 = iVar32, iVar43 != iVar29; iVar43 = iVar43 + 1) {
                  while (iVar30 != 0) {
                    *puVar28 = *puVar41;
                    puVar28 = puVar28 + 1;
                    iVar30 = iVar30 + -1;
                  }
                  for (lVar35 = 0; iVar30 = iVar23, iVar20 != (int)lVar35; lVar35 = lVar35 + 1) {
                    *puVar28 = puVar41[lVar35];
                    puVar28 = puVar28 + 1;
                  }
                  while (iVar30 != 0) {
                    *puVar28 = puVar41[lVar35 + -1];
                    puVar28 = puVar28 + 1;
                    iVar30 = iVar30 + -1;
                  }
                }
              }
            }
            uVar25 = (ulong)((int)uVar25 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      if ((this->super_Padding).type == 0) {
        uVar24 = (this->super_Padding).front + iVar20 + (this->super_Padding).behind;
        uVar25 = (ulong)uVar24;
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar24,uVar36,
                    m.elemsize,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar24 < 1) {
          uVar25 = 0;
        }
        if ((int)uVar36 < 1) {
          uVar22 = 0;
        }
        for (uVar42 = 0; uVar42 != uVar22; uVar42 = uVar42 + 1) {
          uVar21 = (ulong)(this->super_Padding).value;
          uVar21 = uVar21 << 0x38 | uVar21 << 0x30 | uVar21 << 0x28 |
                   uVar21 << 0x20 | uVar21 << 0x18 | uVar21 << 0x10 | uVar21 << 8 | uVar21;
          for (uVar40 = 0; uVar40 != uVar25; uVar40 = uVar40 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            lVar35 = top_blob->cstep * uVar42;
            m.elempack = top_blob->elempack;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)pvVar3 + uVar40 * m.elemsize * m.cstep + lVar35 * m.elemsize);
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            uVar36 = (int)uVar40 - (this->super_Padding).front;
            if ((int)uVar36 < 0 || iVar20 <= (int)uVar36) {
              uVar26 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar26 = 0;
              }
              for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
                *(ulong *)((long)pvVar3 +
                          uVar27 * 8 + m.elemsize * ((long)m.h * uVar40 * (long)m.w + lVar35)) =
                     uVar21;
              }
            }
            else {
              m_1.h = bottom_blob->h;
              m_1.elemsize = bottom_blob->elemsize;
              m_1.allocator = bottom_blob->allocator;
              m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
              m_1.data = (void *)((long)bottom_blob->data +
                                 uVar36 * m_1.elemsize * m_1.cstep +
                                 bottom_blob->cstep * uVar42 * m_1.elemsize);
              m_1.refcount = (int *)0x0;
              m_1.elempack = bottom_blob->elempack;
              m_1.w = bottom_blob->w;
              m_1.dims = 2;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack8_int8_sse
                        (&m_1,&m,(this->super_Padding).top,(this->super_Padding).bottom,
                         (this->super_Padding).left,(this->super_Padding).right,uVar21);
            }
          }
        }
        return 0;
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  m.d = iVar20;
  m.c = uVar36;
  if (m.elempack != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    uVar6 = opt->flush_denormals;
    uVar7 = opt->use_local_pool_allocator;
    uVar9 = opt->use_shader_local_memory;
    uVar11 = opt->use_cooperative_matrix;
    uVar13 = opt->use_winograd23_convolution;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    uVar2._0_1_ = opt->use_winograd43_convolution;
    uVar2._1_1_ = opt->use_winograd63_convolution;
    uVar2._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar2._3_1_ = opt->use_fp16_uniform;
    uVar14 = opt->use_int8_uniform;
    uVar15 = opt->use_reserved_9;
    uVar17 = opt->use_reserved_10;
    uVar19 = opt->use_reserved_11;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar2._4_4_ = CONCAT31(uVar16,uVar14);
    m_1.c = (int)uVar2;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar6;
    m_1.d = uVar8;
    m_1._60_4_ = uVar2._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      iVar20 = -100;
      goto LAB_003c5050;
    }
  }
  iVar20 = Padding::forward(&this->super_Padding,&m,top_blob,opt);
LAB_003c5050:
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int Padding_x86_fma::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}